

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall parser::loadActionMap(parser *this)

{
  long lVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_2a8;
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined4 local_260;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined4 local_238;
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  undefined4 local_210;
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined4 local_1e8;
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined4 local_1c0;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined4 local_198;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined4 local_170;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined4 local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined4 local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined4 local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined4 local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined4 local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined4 local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined4 local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  undefined4 local_30;
  
  local_2a8.first._M_dataplus._M_p = (pointer)&local_2a8.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"go","");
  local_2a8.second = GO;
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"throw","");
  local_260 = 1;
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"look","");
  local_238 = 2;
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"examine","");
  local_210 = 2;
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"rest","");
  local_1e8 = 3;
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"touch","");
  local_1c0 = 4;
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"pickup","");
  local_198 = 5;
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"pick","");
  local_170 = 5;
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"drop","");
  local_148 = 6;
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"use","");
  local_120 = 7;
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"open","");
  local_f8 = 8;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"close","");
  local_d0 = 8;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"help","");
  local_a8 = 0xb;
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
  local_80 = 10;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"quit","");
  local_58 = 0xc;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"exit","");
  local_30 = 0xc;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,actions>,std::_Select1st<std::pair<std::__cxx11::string_const,actions>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,actions>>>
  ::_M_assign_unique<std::pair<std::__cxx11::string_const,actions>const*>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,actions>,std::_Select1st<std::pair<std::__cxx11::string_const,actions>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,actions>>>
              *)&this->actionMap,&local_2a8,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
              *)&stack0xffffffffffffffd8);
  lVar1 = 0;
  do {
    if (local_40 + lVar1 != *(undefined1 **)((long)local_50 + lVar1)) {
      operator_delete(*(undefined1 **)((long)local_50 + lVar1));
    }
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x280);
  return;
}

Assistant:

void parser::loadActionMap() {
    actionMap = {
            {"go", GO},
            {"throw", THROW},
            {"look", LOOK},
            {"examine", LOOK},
            {"rest", REST},
            {"touch", TOUCH},
            {"pickup", PICK},
            {"pick", PICK},
            {"drop", DROP},
            {"use", USE},
            {"open", OPEN},
            {"close", OPEN},
            {"help", HELP},
            {"", NO_ACTION},
            {"quit", EXIT},
            {"exit", EXIT}
    };
}